

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::err_handler_(logger *this,string *msg)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  logger *in_RDI;
  char date_buf [64];
  tm tm_time;
  time_point now;
  lock_guard<std::mutex> lk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff00;
  FILE *__stream;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff08;
  size_t sVar4;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff10;
  char *pcVar5;
  undefined7 in_stack_ffffffffffffff20;
  char local_c8 [64];
  time_t local_88;
  tm local_80;
  uint local_48;
  int local_44;
  duration<long,std::ratio<1l,1l>> local_40 [24];
  rep local_28;
  duration local_20;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)0x1a60fd);
  if (bVar1) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff00,
               (mutex_type *)in_stack_fffffffffffffef8);
    local_20.__r = std::chrono::_V2::system_clock::now();
    err_handler_::err_counter = err_handler_::err_counter + 1;
    local_28 = (rep)std::chrono::operator-
                              (in_stack_ffffffffffffff08,
                               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)in_stack_ffffffffffffff00);
    local_44 = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_40,&local_44);
    bVar1 = std::chrono::operator<
                      (in_stack_ffffffffffffff10,
                       (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff08);
    if (!bVar1) {
      err_handler_::last_report_time.__d.__r = (duration)(duration)local_20.__r;
      local_88 = std::chrono::_V2::system_clock::to_time_t
                           ((time_point *)CONCAT17(bVar1,in_stack_ffffffffffffff20));
      details::os::localtime((os *)&local_80,&local_88);
      strftime(local_c8,0x40,"%Y-%m-%d %H:%M:%S",&local_80);
      pcVar5 = local_c8;
      __stream = _stderr;
      sVar4 = err_handler_::err_counter;
      name_abi_cxx11_(in_RDI);
      uVar2 = std::__cxx11::string::c_str();
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"[*** LOG ERROR #%04zu ***] [%s] [%s] {%s}\n",sVar4,pcVar5,uVar2,uVar3);
    }
    local_48 = (uint)bVar1;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a62d2);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::err_handler_(const std::string &msg)
{
    if (custom_err_handler_)
    {
        custom_err_handler_(msg);
    }
    else
    {
        using std::chrono::system_clock;
        static std::mutex mutex;
        static std::chrono::system_clock::time_point last_report_time;
        static size_t err_counter = 0;
        std::lock_guard<std::mutex> lk{mutex};
        auto now = system_clock::now();
        err_counter++;
        if (now - last_report_time < std::chrono::seconds(1))
        {
            return;
        }
        last_report_time = now;
        auto tm_time = details::os::localtime(system_clock::to_time_t(now));
        char date_buf[64];
        std::strftime(date_buf, sizeof(date_buf), "%Y-%m-%d %H:%M:%S", &tm_time);
        fprintf(stderr, "[*** LOG ERROR #%04zu ***] [%s] [%s] {%s}\n", err_counter, date_buf, name().c_str(), msg.c_str());
    }
}